

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpClient.cpp
# Opt level: O1

void __thiscall sznet::net::KcpWithTcpClient::~KcpWithTcpClient(KcpWithTcpClient *this)

{
  MutexLock *mutex;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  _Tuple_impl<0ul,std::shared_ptr<sznet::net::TcpConnection>,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>>
  *this_00;
  _Tuple_impl<0ul,std::shared_ptr<sznet::net::KcpConnection>,std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>>
  *this_01;
  ulong __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  EventLoop *pEVar2;
  element_type *peVar3;
  _Manager_type p_Var4;
  pointer pcVar5;
  undefined1 auVar6 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  int iVar7;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  undefined1 local_10b8 [32];
  undefined1 local_1098 [16];
  int64_t local_1088;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1080;
  char *local_108 [4];
  _Any_data local_e8;
  code *pcStack_d8;
  code *pcStack_d0;
  _Any_data local_c8;
  code *pcStack_b8;
  code *pcStack_b0;
  _Any_data local_a8;
  code *pcStack_98;
  code *pcStack_90;
  undefined1 auStack_88 [8];
  CloseCallback cb;
  KcpConnectionPtr kcpConn;
  undefined1 auStack_48 [8];
  TcpConnectionPtr tcpConn;
  
  if (g_logLevel < 3) {
    file._8_8_ = 0x14;
    file.m_data = "KcpWithTcpClient.cpp";
    Logger::Logger((Logger *)local_10b8,file,0x3d);
    iVar7 = (int)local_108;
    if (0x24 < (uint)(iVar7 - (int)local_108[0])) {
      builtin_strncpy(local_108[0],"KcpWithTcpClient::~KcpWithTcpClient[",0x24);
      local_108[0] = local_108[0] + 0x24;
    }
    __n = (this->m_name)._M_string_length;
    if (__n < (ulong)(long)(iVar7 - (int)local_108[0])) {
      memcpy(local_108[0],(this->m_name)._M_dataplus._M_p,__n);
      local_108[0] = local_108[0] + __n;
    }
    if (0x12 < (uint)(iVar7 - (int)local_108[0])) {
      builtin_strncpy(local_108[0],"] - tcp connector ",0x12);
      local_108[0] = local_108[0] + 0x12;
    }
    LogStream::operator<<
              ((LogStream *)(local_10b8 + 8),
               (this->m_tcpConnector).
               super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    Logger::~Logger((Logger *)local_10b8);
  }
  auStack_48 = (undefined1  [8])0x0;
  tcpConn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  cb._M_invoker = (_Invoker_type)0x0;
  kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  mutex = &this->m_mutex;
  sz_mutex_lock(&mutex->m_mutex);
  MutexLock::assignHolder(mutex);
  __r = &(this->m_tcpConnection).
         super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var1 = (this->m_tcpConnection).
           super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    tcpConn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = 0;
  }
  else {
    iVar7 = p_Var1->_M_use_count;
    tcpConn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = CONCAT31((int3)((uint)iVar7 >> 8),iVar7 == 1);
  }
  auStack_48 = (undefined1  [8])
               (this->m_tcpConnection).
               super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tcpConn,__r);
  kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          &(this->m_kcpConnection).
           super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  cb._M_invoker =
       (_Invoker_type)
       (this->m_kcpConnection).
       super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&kcpConn,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  (this->m_mutex).m_holder = 0;
  sz_mutex_unlock(&mutex->m_mutex);
  if (auStack_48 == (undefined1  [8])0x0) {
    if (g_logLevel < 3) {
      file_00._8_8_ = 0x14;
      file_00.m_data = "KcpWithTcpClient.cpp";
      Logger::Logger((Logger *)local_10b8,file_00,0x5c);
      if (0x19 < (uint)((int)local_108 - (int)local_108[0])) {
        builtin_strncpy(local_108[0],"m_tcpConnector release!!!",0x19);
        local_108[0] = local_108[0] + 0x19;
      }
      Logger::~Logger((Logger *)local_10b8);
    }
    Connector::stop((this->m_tcpConnector).
                    super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    pEVar2 = this->m_loop;
    peVar3 = (this->m_tcpConnector).
             super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = (this->m_tcpConnector).
             super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    local_c8._M_unused._M_object = (void *)0x0;
    local_c8._8_8_ = 0;
    pcStack_b8 = (code *)0x0;
    pcStack_b0 = (code *)0x0;
    local_c8._M_unused._M_object = operator_new(0x18);
    *(code **)local_c8._M_unused._0_8_ = detail::removeTcpConnector;
    *(element_type **)((long)local_c8._M_unused._0_8_ + 8) = peVar3;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_c8._M_unused._0_8_ + 0x10) =
         p_Var1;
    pcStack_b0 = std::
                 _Function_handler<void_(),_std::_Bind<void_(*(std::shared_ptr<sznet::net::Connector>))(const_std::shared_ptr<sznet::net::Connector>_&)>_>
                 ::_M_invoke;
    pcStack_b8 = std::
                 _Function_handler<void_(),_std::_Bind<void_(*(std::shared_ptr<sznet::net::Connector>))(const_std::shared_ptr<sznet::net::Connector>_&)>_>
                 ::_M_manager;
    EventLoop::runAfter(pEVar2,1.0,(TimerCallback *)&local_c8);
    if (pcStack_b8 != (code *)0x0) {
      (*pcStack_b8)(&local_c8,&local_c8,__destroy_functor);
    }
  }
  else {
    pEVar2 = this->m_loop;
    if (pEVar2 != *(EventLoop **)((long)auStack_48 + 0x10)) {
      __assert_fail("m_loop == tcpConn->getLoop()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpClient.cpp"
                    ,0x4e,"sznet::net::KcpWithTcpClient::~KcpWithTcpClient()");
    }
    auStack_88 = (undefined1  [8])0x0;
    cb.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    cb.super__Function_base._M_functor._8_8_ = 0;
    cb.super__Function_base._M_manager = (_Manager_type)0x0;
    auStack_88 = (undefined1  [8])operator_new(0x10);
    *(code **)auStack_88 = detail::removeTcpConnection;
    *(EventLoop **)((long)auStack_88 + 8) = pEVar2;
    cb.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&),_std::_Bind<void_(*(sznet::net::EventLoop_*,_std::_Placeholder<1>))(sznet::net::EventLoop_*,_const_std::shared_ptr<sznet::net::TcpConnection>_&)>_>
         ::_M_invoke;
    cb.super__Function_base._M_functor._8_8_ =
         std::
         _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&),_std::_Bind<void_(*(sznet::net::EventLoop_*,_std::_Placeholder<1>))(sznet::net::EventLoop_*,_const_std::shared_ptr<sznet::net::TcpConnection>_&)>_>
         ::_M_manager;
    this_00 = (_Tuple_impl<0ul,std::shared_ptr<sznet::net::TcpConnection>,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>>
               *)(local_10b8 + 0x10);
    local_10b8._0_8_ = TcpConnection::setCloseCallback;
    local_10b8._8_8_ = 0;
    std::
    _Tuple_impl<0ul,std::shared_ptr<sznet::net::TcpConnection>,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>>
    ::
    _Tuple_impl<std::shared_ptr<sznet::net::TcpConnection>&,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>&,void>
              (this_00,(shared_ptr<sznet::net::TcpConnection> *)auStack_48,
               (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)auStack_88);
    local_e8._M_unused._M_object = (void *)0x0;
    local_e8._8_8_ = 0;
    pcStack_d8 = (code *)0x0;
    pcStack_d0 = (code *)0x0;
    local_e8._M_unused._M_object = operator_new(0x40);
    p_Var1 = local_1080;
    *(undefined8 *)local_e8._M_unused._0_8_ = local_10b8._0_8_;
    *(undefined8 *)((long)local_e8._M_unused._0_8_ + 8) = local_10b8._8_8_;
    *(undefined1 (*) [16])((long)local_e8._M_unused._0_8_ + 0x10) = ZEXT816(0) << 0x20;
    *(int64_t *)((long)local_e8._M_unused._0_8_ + 0x20) = 0;
    *(undefined8 *)((long)local_e8._M_unused._0_8_ + 0x28) = local_1098._8_8_;
    auVar6 = local_1098;
    if (local_1098._0_8_ != 0) {
      *(undefined8 *)((long)local_e8._M_unused._0_8_ + 0x10) = local_10b8._16_8_;
      *(undefined8 *)((long)local_e8._M_unused._0_8_ + 0x18) = local_10b8._24_8_;
      *(undefined8 *)((long)local_e8._M_unused._0_8_ + 0x20) = local_1098._0_8_;
      auVar6 = ZEXT816(0) << 0x20;
    }
    local_1098 = auVar6;
    *(int64_t *)((long)local_e8._M_unused._0_8_ + 0x30) = local_1088;
    *(int64_t *)((long)local_e8._M_unused._0_8_ + 0x38) = 0;
    local_1080 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_e8._M_unused._0_8_ + 0x38) =
         p_Var1;
    local_1088 = 0;
    pcStack_d0 = std::
                 _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>,_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>))(const_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_&)>_>
                 ::_M_invoke;
    pcStack_d8 = std::
                 _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>,_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>))(const_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_&)>_>
                 ::_M_manager;
    EventLoop::runInLoop(pEVar2,(Functor *)&local_e8);
    if (pcStack_d8 != (code *)0x0) {
      (*pcStack_d8)(&local_e8,&local_e8,__destroy_functor);
    }
    if (local_1080 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1080);
    }
    if ((code *)local_1098._0_8_ != (code *)0x0) {
      (*(code *)local_1098._0_8_)(this_00,this_00,3);
    }
    if (tcpConn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_1_ != '\0') {
      TcpConnection::forceClose((TcpConnection *)auStack_48);
    }
    if (cb.super__Function_base._M_functor._8_8_ != 0) {
      (*(code *)cb.super__Function_base._M_functor._8_8_)(auStack_88,auStack_88,3);
    }
  }
  if (cb._M_invoker == (_Invoker_type)0x0) {
    if (g_logLevel < 3) {
      file_01._8_8_ = 0x14;
      file_01.m_data = "KcpWithTcpClient.cpp";
      Logger::Logger((Logger *)local_10b8,file_01,0x71);
      if (0x19 < (uint)((int)local_108 - (int)local_108[0])) {
        builtin_strncpy(local_108[0],"m_kcpConnector release!!!",0x19);
        local_108[0] = local_108[0] + 0x19;
      }
      Logger::~Logger((Logger *)local_10b8);
    }
  }
  else {
    pEVar2 = this->m_loop;
    if (pEVar2 != *(EventLoop **)(cb._M_invoker + 0x10)) {
      __assert_fail("m_loop == kcpConn->getLoop()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpClient.cpp"
                    ,99,"sznet::net::KcpWithTcpClient::~KcpWithTcpClient()");
    }
    auStack_88 = (undefined1  [8])0x0;
    cb.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    cb.super__Function_base._M_functor._8_8_ = 0;
    cb.super__Function_base._M_manager = (_Manager_type)0x0;
    auStack_88 = (undefined1  [8])operator_new(0x10);
    *(code **)auStack_88 = detail::removeKcpConnection;
    *(EventLoop **)((long)auStack_88 + 8) = pEVar2;
    cb.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int),_std::_Bind<void_(*(sznet::net::EventLoop_*,_std::_Placeholder<1>))(sznet::net::EventLoop_*,_const_std::shared_ptr<sznet::net::KcpConnection>_&)>_>
         ::_M_invoke;
    cb.super__Function_base._M_functor._8_8_ =
         std::
         _Function_handler<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int),_std::_Bind<void_(*(sznet::net::EventLoop_*,_std::_Placeholder<1>))(sznet::net::EventLoop_*,_const_std::shared_ptr<sznet::net::KcpConnection>_&)>_>
         ::_M_manager;
    this_01 = (_Tuple_impl<0ul,std::shared_ptr<sznet::net::KcpConnection>,std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>>
               *)(local_10b8 + 0x10);
    local_10b8._0_8_ = KcpConnection::setKcpCloseCallback;
    local_10b8._8_8_ = 0;
    std::
    _Tuple_impl<0ul,std::shared_ptr<sznet::net::KcpConnection>,std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>>
    ::
    _Tuple_impl<std::shared_ptr<sznet::net::KcpConnection>&,std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>&,void>
              (this_01,(shared_ptr<sznet::net::KcpConnection> *)&cb._M_invoker,
               (function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)> *)
               auStack_88);
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    pcStack_98 = (code *)0x0;
    pcStack_90 = (code *)0x0;
    local_a8._M_unused._M_object = operator_new(0x40);
    p_Var1 = local_1080;
    *(undefined8 *)local_a8._M_unused._0_8_ = local_10b8._0_8_;
    *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = local_10b8._8_8_;
    *(undefined1 (*) [16])((long)local_a8._M_unused._0_8_ + 0x10) = ZEXT816(0) << 0x20;
    *(int64_t *)((long)local_a8._M_unused._0_8_ + 0x20) = 0;
    *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x28) = local_1098._8_8_;
    auVar6 = local_1098;
    if (local_1098._0_8_ != 0) {
      *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x10) = local_10b8._16_8_;
      *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x18) = local_10b8._24_8_;
      *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x20) = local_1098._0_8_;
      auVar6 = ZEXT816(0) << 0x20;
    }
    local_1098 = auVar6;
    *(int64_t *)((long)local_a8._M_unused._0_8_ + 0x30) = local_1088;
    *(int64_t *)((long)local_a8._M_unused._0_8_ + 0x38) = 0;
    local_1080 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_a8._M_unused._0_8_ + 0x38) =
         p_Var1;
    local_1088 = 0;
    pcStack_90 = std::
                 _Function_handler<void_(),_std::_Bind<void_(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>,_std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>))(const_std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>_&)>_>
                 ::_M_invoke;
    pcStack_98 = std::
                 _Function_handler<void_(),_std::_Bind<void_(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>,_std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>))(const_std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>_&)>_>
                 ::_M_manager;
    EventLoop::runInLoop(pEVar2,(Functor *)&local_a8);
    if (pcStack_98 != (code *)0x0) {
      (*pcStack_98)(&local_a8,&local_a8,__destroy_functor);
    }
    if (local_1080 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1080);
    }
    if ((code *)local_1098._0_8_ != (code *)0x0) {
      (*(code *)local_1098._0_8_)(this_01,this_01,3);
    }
    if (tcpConn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_1_ != '\0') {
      TcpConnection::forceClose((TcpConnection *)auStack_48);
    }
    if (cb.super__Function_base._M_functor._8_8_ != 0) {
      (*(code *)cb.super__Function_base._M_functor._8_8_)(auStack_88,auStack_88,3);
    }
  }
  if (kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  if (tcpConn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               tcpConn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      (kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_vptr__Sp_counted_base != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_vptr__Sp_counted_base);
  }
  p_Var4 = (this->m_tcpCodec).m_messageCallback.super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->m_tcpCodec,(_Any_data *)&this->m_tcpCodec,__destroy_functor);
  }
  p_Var1 = __r->_M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  MutexLock::~MutexLock(mutex);
  p_Var4 = (this->m_kcpWriteCompleteCallback).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->m_kcpWriteCompleteCallback,
              (_Any_data *)&this->m_kcpWriteCompleteCallback,__destroy_functor);
  }
  p_Var4 = (this->m_kcpMessageCallback).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->m_kcpMessageCallback,(_Any_data *)&this->m_kcpMessageCallback,
              __destroy_functor);
  }
  p_Var4 = (this->m_kcpConnectionCallback).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->m_kcpConnectionCallback,
              (_Any_data *)&this->m_kcpConnectionCallback,__destroy_functor);
  }
  pcVar5 = (this->m_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != &(this->m_name).field_2) {
    operator_delete(pcVar5);
  }
  p_Var1 = (this->m_tcpConnector).
           super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  return;
}

Assistant:

KcpWithTcpClient::~KcpWithTcpClient()
{
	LOG_INFO << "KcpWithTcpClient::~KcpWithTcpClient[" << m_name 
		<< "] - tcp connector " << get_pointer(m_tcpConnector);
	TcpConnectionPtr tcpConn;
	KcpConnectionPtr kcpConn;
	// TCP & KCP �����Ƿ���KcpWithTcpClient(owner)���Գ���
	bool uniqueTcp = false;
	bool uniqueKcp = false;
	{
		MutexLockGuard lock(m_mutex);
		uniqueTcp = m_tcpConnection.use_count() == 1;
		// TcpClient������Ҫ�����ˣ��ڲ���Ҫ������
		tcpConn = m_tcpConnection;
		uniqueKcp = m_kcpConnection.use_count() == 1;
		kcpConn = m_kcpConnection;
	}
	if (tcpConn)
	{
		assert(m_loop == tcpConn->getLoop());
		// ���������Ƿ����Գ���tcp���ӣ�����Ҫ�����ƺ����ˣ���ֹtcp�����ڴ�й¶
		// FIXME: not 100% safe, if we are in different thread
		CloseCallback cb = std::bind(&detail::removeTcpConnection, m_loop, std::placeholders::_1);
		m_loop->runInLoop(std::bind(&TcpConnection::setCloseCallback, tcpConn, cb));
		// ���Գ��У�ֱ��ǿ�ƹر�
		if (uniqueTcp)
		{
			tcpConn->forceClose();
		}
	}
	// tcp�����Ѿ����ͷ��ˣ���ô���ֵģ�
	else
	{
		LOG_INFO << "m_tcpConnector release!!!";
		m_tcpConnector->stop();
		// FIXME: HACK
		m_loop->runAfter(1, std::bind(&detail::removeTcpConnector, m_tcpConnector));
	}
	if (kcpConn)
	{
		assert(m_loop == kcpConn->getLoop());
		// ���������Ƿ����Գ���tcp���ӣ�����Ҫ�����ƺ����ˣ���ֹtcp�����ڴ�й¶
		// FIXME: not 100% safe, if we are in different thread
		KcpCloseCallback cb = std::bind(&detail::removeKcpConnection, m_loop, std::placeholders::_1);
		m_loop->runInLoop(std::bind(&KcpConnection::setKcpCloseCallback, kcpConn, cb));
		// ���Գ��У�ֱ��ǿ�ƹر�
		if (uniqueTcp)
		{
			tcpConn->forceClose();
		}
	}
	// kcp�����Ѿ����ͷ��ˣ���ô���ֵģ�
	else
	{
		LOG_INFO << "m_kcpConnector release!!!";
	}
}